

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

char * get_drive(char *path,char *dest)

{
  char *pcVar1;
  
  if (dest != (char *)0x0) {
    pcVar1 = (char *)memset(dest,0,0x104);
    return pcVar1;
  }
  return (char *)0x0;
}

Assistant:

char *get_drive(const char *path, char *dest)
{
	if (dest == NULL)
	{
		return NULL;
	}
	clear_path_string(dest, MAX_PATH);
#if defined(_WIN32)
	char ch = path[0];
	if (path[1] == ':' && ((ch >= 'A' && ch <= 'Z') || (ch >= 'a' && ch <= 'z')))
	{
		dest[0] = ch;
		dest[1] = ':';
		dest[2] = '\0';
	}
#endif
	return dest;
}